

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testSharedFrameBuffer.cpp
# Opt level: O1

void __thiscall anon_unknown.dwarf_2a1ee8::WriterThread::run(WriterThread *this)

{
  int iVar1;
  int iVar2;
  double dVar3;
  
  IlmThread_2_5::Semaphore::post();
  while( true ) {
    iVar2 = pthread_mutex_lock((pthread_mutex_t *)(anonymous_namespace)::scanlineMutex);
    iVar1 = (anonymous_namespace)::remainingScanlines;
    if (iVar2 != 0) {
      std::__throw_system_error(iVar2);
    }
    if ((anonymous_namespace)::remainingScanlines == 0) break;
    dVar3 = (double)Imath_2_5::erand48((ushort *)&(anonymous_namespace)::rand1);
    iVar2 = (int)((double)iVar1 * dVar3 + (1.0 - dVar3) * 0.0 + 0.5);
    Imf_2_5::RgbaOutputFile::writePixels(this->_outfile,iVar2);
    (anonymous_namespace)::remainingScanlines = (anonymous_namespace)::remainingScanlines - iVar2;
    pthread_mutex_unlock((pthread_mutex_t *)(anonymous_namespace)::scanlineMutex);
    if (iVar1 == 0) {
      return;
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)(anonymous_namespace)::scanlineMutex);
  return;
}

Assistant:

void
WriterThread::run ()
{
    //
    // Signal that the thread has started
    //

    threadSemaphore.post();

    while (true)
    {
	Lock lock (scanlineMutex);

	if (remainingScanlines)
	{
	    int n = int (rand1.nextf (0.0f, remainingScanlines) + 0.5f);
	    _outfile->writePixels (n);
	    remainingScanlines -= n;
	}
	else
	{
	    break;
	}
    }
}